

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<unsigned_char,signed_char>(char *types)

{
  bool bVar1;
  TestCase<unsigned_char,_signed_char,_3> TVar2;
  char *pcVar3;
  string msg_2;
  uchar x;
  string msg_1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uchar ret;
  TestCase<unsigned_char,_signed_char,_3> test;
  TestVector<unsigned_char,_signed_char,_3> tests;
  undefined7 in_stack_fffffffffffffdb8;
  char in_stack_fffffffffffffdbf;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffdc0;
  TestVector<unsigned_char,_signed_char,_3> *in_stack_fffffffffffffdc8;
  allocator *in_stack_fffffffffffffdd0;
  undefined1 local_1e1 [30];
  undefined1 in_stack_fffffffffffffe3d;
  char in_stack_fffffffffffffe3e;
  uchar in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [37];
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_153;
  uchar local_152;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [37];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [37];
  undefined2 local_23;
  byte local_21;
  TestVector<unsigned_char,_signed_char,_3> local_20;
  
  TestVector<unsigned_char,_signed_char,_3>::TestVector(&local_20);
  TVar2 = TestVector<unsigned_char,_signed_char,_3>::GetNext(in_stack_fffffffffffffdc8);
  local_23 = TVar2._0_2_;
  local_21 = TVar2.fExpected;
  while( true ) {
    bVar1 = TestVector<unsigned_char,_signed_char,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<unsigned_char,signed_char>
                      ((uchar)((ulong)in_stack_fffffffffffffdc0 >> 0x38),
                       (char)((ulong)in_stack_fffffffffffffdc0 >> 0x30),
                       (uchar *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    if (bVar1 != (bool)(local_21 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Error in case ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar3,&local_c1);
      err_msg<unsigned_char,signed_char>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe3e,
                 (bool)in_stack_fffffffffffffe3d);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_48);
    }
    local_c2 = 1;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_c3,(uchar *)&local_23);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbf);
    if ((local_c2 & 1) != (local_21 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Error in case ",&local_129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar3,&local_151);
      err_msg<unsigned_char,signed_char>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe3e,
                 (bool)in_stack_fffffffffffffe3d);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_e8);
    }
    local_c2 = 1;
    local_152 = (uchar)local_23;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_153,(char *)((long)&local_23 + 1));
    operator+=((uchar *)in_stack_fffffffffffffdc8,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    if ((local_c2 & 1) != (local_21 & 1)) {
      in_stack_fffffffffffffdd0 = (allocator *)&stack0xfffffffffffffe47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Error in case ",in_stack_fffffffffffffdd0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
      in_stack_fffffffffffffdc0 =
           (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffdc8 = (TestVector<unsigned_char,_signed_char,_3> *)local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1e1 + 1),(char *)in_stack_fffffffffffffdc0,
                 (allocator *)in_stack_fffffffffffffdc8);
      err_msg<unsigned_char,signed_char>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe3e,
                 (bool)in_stack_fffffffffffffe3d);
      std::__cxx11::string::~string((string *)(local_1e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e1);
      std::__cxx11::string::~string(local_178);
    }
    TVar2 = TestVector<unsigned_char,_signed_char,_3>::GetNext(in_stack_fffffffffffffdc8);
    local_23 = TVar2._0_2_;
    local_21 = TVar2.fExpected;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}